

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrSpatialAnchorsQueryCompletionML *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  byte bVar1;
  XrStructureType XVar2;
  XrResult XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  PFN_xrResultToString p_Var6;
  XrStructureType __val;
  XrResult __val_00;
  uint uVar7;
  bool bVar8;
  char *pcVar9;
  XrInstance pXVar10;
  invalid_argument *this;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  string next_prefix;
  string type_prefix;
  string futureresult_prefix;
  string uuids_prefix;
  string uuidcountoutput_prefix;
  string uuidcapacityinput_prefix;
  ostringstream oss_uuidCapacityInput;
  ostringstream oss_uuidCountOutput;
  ostringstream oss_uuids;
  long *local_598;
  long local_590;
  long local_588 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  string local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  ios_base local_428 [264];
  undefined1 local_320 [24];
  uint auStack_308 [22];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  local_320._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_498,'\x12');
  *local_498._M_dataplus._M_p = '0';
  local_498._M_dataplus._M_p[1] = 'x';
  pcVar9 = local_498._M_dataplus._M_p + (local_498._M_string_length - 1);
  lVar12 = 0;
  do {
    bVar1 = local_320[lVar12];
    *pcVar9 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar9[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar12 = lVar12 + 1;
    pcVar9 = pcVar9 + -2;
  } while (lVar12 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_578,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_578);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar2 = value->type;
    __val = -XVar2;
    if (0 < (int)XVar2) {
      __val = XVar2;
    }
    uVar14 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar13 = (ulong)__val;
      uVar7 = 4;
      do {
        uVar14 = uVar7;
        uVar11 = (uint)uVar13;
        if (uVar11 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_001b0b13;
        }
        if (uVar11 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_001b0b13;
        }
        if (uVar11 < 10000) goto LAB_001b0b13;
        uVar13 = uVar13 / 10000;
        uVar7 = uVar14 + 4;
      } while (99999 < uVar11);
      uVar14 = uVar14 + 1;
    }
LAB_001b0b13:
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_498,(char)uVar14 - (char)((int)XVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_498._M_dataplus._M_p + (XVar2 >> 0x1f),uVar14,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_578,&local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_468 = 0;
    uStack_460 = 0;
    local_478 = 0;
    uStack_470 = 0;
    local_498.field_2._M_allocated_capacity = 0;
    local_498.field_2._8_8_ = 0;
    local_498._M_dataplus._M_p = (pointer)0x0;
    local_498._M_string_length = 0;
    p_Var5 = gen_dispatch_table->StructureTypeToString;
    pXVar10 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var5)(pXVar10,value->type,(char *)&local_498);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_578,(char (*) [64])&local_498);
  }
  local_598 = local_588;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_598,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_598);
  value_00 = value->next;
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d8,local_598,local_590 + (long)local_598);
  bVar8 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_4d8,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar8) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid Operation");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_558,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_558);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->futureResult;
    __val_00 = -XVar3;
    if (XR_SUCCESS < XVar3) {
      __val_00 = XVar3;
    }
    uVar14 = 1;
    if (9 < (uint)__val_00) {
      uVar13 = (ulong)(uint)__val_00;
      uVar7 = 4;
      do {
        uVar14 = uVar7;
        uVar11 = (uint)uVar13;
        if (uVar11 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_001b0d20;
        }
        if (uVar11 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_001b0d20;
        }
        if (uVar11 < 10000) goto LAB_001b0d20;
        uVar13 = uVar13 / 10000;
        uVar7 = uVar14 + 4;
      } while (99999 < uVar11);
      uVar14 = uVar14 + 1;
    }
LAB_001b0d20:
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_498,(char)uVar14 - (char)(XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_498._M_dataplus._M_p + ((uint)XVar3 >> 0x1f),uVar14,__val_00);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"XrResult",&local_558,&local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_468 = 0;
    uStack_460 = 0;
    local_478 = 0;
    uStack_470 = 0;
    local_498.field_2._M_allocated_capacity = 0;
    local_498.field_2._8_8_ = 0;
    local_498._M_dataplus._M_p = (pointer)0x0;
    local_498._M_string_length = 0;
    p_Var6 = gen_dispatch_table->ResultToString;
    pXVar10 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var6)(pXVar10,value->futureResult,(char *)&local_498);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"XrResult",&local_558,(char (*) [64])&local_498);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4f8,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_4f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"0x",2);
  *(uint *)((long)&local_498.field_2 + *(long *)(local_498._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_498.field_2 + *(long *)(local_498._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_498);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_4f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
  if ((XrSpatialAnchorsQueryCompletionML *)local_320._0_8_ !=
      (XrSpatialAnchorsQueryCompletionML *)(local_320 + 0x10)) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_518,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_518);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"0x",2);
  *(uint *)((long)auStack_308 + *(long *)(local_320._0_8_ + -0x18)) =
       *(uint *)((long)auStack_308 + *(long *)(local_320._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_320);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_518,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_538,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_538);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[11],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [11])0x2a28d5,&local_538,&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
  std::ios_base::~ios_base(local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if (local_598 != local_588) {
    operator_delete(local_598,local_588[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpatialAnchorsQueryCompletionML* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string futureresult_prefix = prefix;
        futureresult_prefix += "futureResult";
        if (nullptr != gen_dispatch_table) {
            char futureResult_string[XR_MAX_RESULT_STRING_SIZE] = {};
            gen_dispatch_table->ResultToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                               value->futureResult, futureResult_string);
            contents.emplace_back("XrResult", futureresult_prefix, futureResult_string);
        } else {
                        contents.emplace_back("XrResult", futureresult_prefix, std::to_string(value->futureResult));
        }
        std::string uuidcapacityinput_prefix = prefix;
        uuidcapacityinput_prefix += "uuidCapacityInput";
        std::ostringstream oss_uuidCapacityInput;
        oss_uuidCapacityInput << "0x" << std::hex << (value->uuidCapacityInput);
        contents.emplace_back("uint32_t", uuidcapacityinput_prefix, oss_uuidCapacityInput.str());
        std::string uuidcountoutput_prefix = prefix;
        uuidcountoutput_prefix += "uuidCountOutput";
        std::ostringstream oss_uuidCountOutput;
        oss_uuidCountOutput << "0x" << std::hex << (value->uuidCountOutput);
        contents.emplace_back("uint32_t", uuidcountoutput_prefix, oss_uuidCountOutput.str());
        std::string uuids_prefix = prefix;
        uuids_prefix += "uuids";
        std::ostringstream oss_uuids;
        oss_uuids << std::hex << reinterpret_cast<const void*>(value->uuids);
        contents.emplace_back("XrUuidEXT*", uuids_prefix, oss_uuids.str());
        return true;
    } catch(...) {
    }
    return false;
}